

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

ExprPtr __thiscall pegmatite::operator____E(pegmatite *this,char *x,size_t len)

{
  StringExpr *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExprPtr EVar1;
  size_t len_local;
  char *x_local;
  
  this_00 = (StringExpr *)operator_new(0x20);
  anon_unknown.dwarf_50a29::StringExpr::StringExpr(this_00,x,len);
  ExprPtr::ExprPtr((ExprPtr *)this,(Expr *)this_00);
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ExprPtr)EVar1.super_shared_ptr<pegmatite::Expr>.
                  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr operator "" _E(const char *x, std::size_t len)
{
	return ExprPtr(new StringExpr(x, len));
}